

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineShaderStageModuleIdentifierCreateInfoEXT *create_info,
          ScratchAllocator *alloc)

{
  uint uVar1;
  void *__src;
  undefined8 uVar2;
  uint8_t *puVar3;
  undefined8 *puVar4;
  void *pvVar5;
  ptrdiff_t _Num;
  size_t size;
  
  puVar4 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (puVar4 != (undefined8 *)0x0) {
    uVar2 = *(undefined8 *)create_info;
    pvVar5 = create_info->pNext;
    puVar3 = create_info->pIdentifier;
    puVar4[2] = *(undefined8 *)&create_info->identifierSize;
    puVar4[3] = puVar3;
    *puVar4 = uVar2;
    puVar4[1] = pvVar5;
  }
  uVar1 = *(uint *)(puVar4 + 2);
  size = 0x20;
  if (uVar1 < 0x20) {
    size = (size_t)uVar1;
  }
  *(int *)(puVar4 + 2) = (int)size;
  if (uVar1 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    __src = (void *)puVar4[3];
    pvVar5 = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (pvVar5 != (void *)0x0) {
      memmove(pvVar5,__src,size);
    }
  }
  puVar4[3] = pvVar5;
  return puVar4;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineShaderStageModuleIdentifierCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc)
{
	auto *identifier = copy(create_info, 1, alloc);
	// Safeguard since we'll be copying these to stack variables later.
	identifier->identifierSize =
			std::min<uint32_t>(identifier->identifierSize, VK_MAX_SHADER_MODULE_IDENTIFIER_SIZE_EXT);
	identifier->pIdentifier = copy(identifier->pIdentifier, identifier->identifierSize, alloc);
	return identifier;
}